

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generalizers.cpp
# Opt level: O1

bool pop_up_ask_location(Am_Object *sel_widget,bool growing,Am_Object *ref_obj,int *ask_left,
                        int *ask_top,int *ask_width,int *ask_height,int old_width,int old_height)

{
  Am_Slot_Key AVar1;
  bool bVar2;
  Am_Value *pAVar3;
  Am_Wrapper *pAVar4;
  Am_Object *pAVar5;
  ostream *poVar6;
  char *value;
  Am_Value ok;
  bool as_line;
  Am_Object local_90;
  Am_Object local_88;
  Am_Object local_80;
  Am_Value local_78;
  Am_Object local_68;
  Am_Object local_60;
  Am_Object local_58;
  Am_Object local_50;
  Am_Object local_48;
  int *local_40;
  int *local_38;
  
  local_40 = ask_top;
  local_38 = ask_width;
  bVar2 = Am_Object::Valid(ref_obj);
  if (bVar2) {
    pAVar3 = Am_Object::Get(ref_obj,Am_LOCATION_PLACEHOLDER,3);
    Am_Object::Am_Object(&local_88,pAVar3);
    bVar2 = Am_Object::Valid(&local_88);
    if (!bVar2) {
      Am_Object::Get_Object(&local_90,(Am_Slot_Key)sel_widget,0x1df);
      Am_Object::Copy((Am_Object *)&local_78,(char *)&local_90);
      Am_Object::~Am_Object(&local_90);
      Am_Object::Create(&local_68,(char *)&Am_New_Points_Interactor);
      pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)&local_78);
      pAVar5 = Am_Object::Set(&local_68,0xdc,pAVar4,0);
      pAVar5 = Am_Object::Set(pAVar5,0xcd,0x6e,0);
      pAVar5 = Am_Object::Set(pAVar5,0xde,done_location_ask_inter.from_wrapper,0);
      Am_Object::Get_Object(&local_80,(Am_Slot_Key)pAVar5,0xc5);
      pAVar5 = Am_Object::Set(&local_80,0x154,-1,0);
      Am_Object::Get_Object(&local_90,(Am_Slot_Key)pAVar5,10);
      Am_Object::operator=(&local_88,&local_90);
      Am_Object::~Am_Object(&local_90);
      Am_Object::~Am_Object(&local_80);
      Am_Object::~Am_Object(&local_68);
      AVar1 = Am_LOCATION_PLACEHOLDER;
      Am_Object::Am_Object(&local_48,&local_88);
      pAVar5 = Am_Object::Add_Part(ref_obj,AVar1,&local_48,0);
      Am_Object::Am_Object(&local_50,(Am_Object *)&local_78);
      Am_Object::Add_Part(pAVar5,&local_50,true,0);
      Am_Object::~Am_Object(&local_50);
      Am_Object::~Am_Object(&local_48);
      Am_Object::~Am_Object((Am_Object *)&local_78);
    }
    pAVar5 = Am_Object::Set(&local_88,0xcc,true,0);
    AVar1 = Am_LOCATION_PLACEHOLDER;
    pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(&am_askclickpos);
    Am_Object::Set(pAVar5,AVar1,pAVar4,1);
    if (growing) {
      pAVar5 = Am_Object::Set(&local_88,0xdf,2,0);
      pAVar5 = Am_Object::Set(pAVar5,0xd7,0,0);
      Am_Object::Set(pAVar5,0xd8,0,0);
      value = "Press and drag in the window to define a new position and size";
    }
    else {
      pAVar5 = Am_Object::Set(&local_88,0xdf,1,0);
      pAVar5 = Am_Object::Set(pAVar5,0xd7,old_width,0);
      Am_Object::Set(pAVar5,0xd8,old_height,0);
      value = "Click in the window to define a new position";
    }
    Am_Object::Set(&am_askclickpos,0x169,0,0);
    Am_Object::Get_Object((Am_Object *)&local_78,0x1478,0x150);
    Am_Object::Set((Am_Object *)&local_78,0xab,value,0);
    Am_Object::~Am_Object((Am_Object *)&local_78);
    local_78.type = 0;
    local_78.value.wrapper_value = (Am_Wrapper *)0x0;
    Am_Object::Am_Object(&local_58,&am_askclickpos);
    Am_Pop_Up_Window_And_Wait(&local_58,&local_78,false);
    Am_Object::~Am_Object(&local_58);
    Am_Object::Set(&local_88,0xcc,false,0);
    bVar2 = Am_Value::Valid(&local_78);
    if (bVar2) {
      pAVar3 = Am_Object::Get(&am_askclickpos,0x169,0);
      Am_Inter_Location::Am_Inter_Location((Am_Inter_Location *)&local_90,pAVar3);
      if (am_sdebug == true) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"pop up returned the value ",0x1a);
        poVar6 = operator<<((ostream *)&std::cout,(Am_Inter_Location *)&local_90);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        std::ostream::flush();
      }
      local_80.data = (Am_Object_Data *)0x0;
      Am_Object::Am_Object(&local_60,ref_obj);
      Am_Inter_Location::Translate_To((Am_Inter_Location *)&local_90,&local_60);
      Am_Object::~Am_Object(&local_60);
      Am_Inter_Location::Get_Location
                ((Am_Inter_Location *)&local_90,(bool *)&local_68,&local_80,ask_left,local_40,
                 local_38,ask_height);
      Am_Object::~Am_Object(&local_80);
      Am_Inter_Location::~Am_Inter_Location((Am_Inter_Location *)&local_90);
    }
    Am_Value::~Am_Value(&local_78);
    Am_Object::~Am_Object(&local_88);
    return bVar2;
  }
  poVar6 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
  poVar6 = std::operator<<(poVar6,"No ref_object for pop_up_ask_location");
  std::endl<char,std::char_traits<char>>(poVar6);
  Am_Error();
}

Assistant:

bool
pop_up_ask_location(Am_Object &sel_widget, bool growing, Am_Object &ref_obj,
                    int &ask_left, int &ask_top, int &ask_width,
                    int &ask_height, int old_width, int old_height)
{
  if (!ref_obj.Valid()) {
    Am_ERROR("No ref_object for pop_up_ask_location");
  }
  Am_Object inter =
      ref_obj.Get(Am_LOCATION_PLACEHOLDER, Am_RETURN_ZERO_ON_ERROR);
  const char *msg;
  if (!inter.Valid()) {
    Am_Object feedback = sel_widget.Get_Object(Am_RECT_FEEDBACK_OBJECT).Copy();
    inter = Am_New_Points_Interactor.Create()
                .Set(Am_FEEDBACK_OBJECT, feedback)
                .Set(Am_PRIORITY, 110)
                .Set(Am_CREATE_NEW_OBJECT_METHOD, done_location_ask_inter)
                .Get_Object(Am_COMMAND)
                .Set(Am_IMPLEMENTATION_PARENT, Am_NOT_USUALLY_UNDONE)
                .Get_Owner();
    ref_obj.Add_Part(Am_LOCATION_PLACEHOLDER, inter).Add_Part(feedback);
  }
  inter.Set(Am_ACTIVE, true)
      .Set(Am_LOCATION_PLACEHOLDER, am_askclickpos, Am_OK_IF_NOT_THERE);
  if (growing) {
    inter.Set(Am_HOW_MANY_POINTS, 2)
        .Set(Am_MINIMUM_WIDTH, 0)
        .Set(Am_MINIMUM_HEIGHT, 0);
    msg = "Press and drag in the window to define a new position and size";
  } else {
    inter.Set(Am_HOW_MANY_POINTS, 1)
        .Set(Am_MINIMUM_WIDTH, old_width)
        .Set(Am_MINIMUM_HEIGHT, old_height);
    msg = "Click in the window to define a new position";
  }
  am_askclickpos.Set(Am_VALUE, (0L));
  am_askclickpos.Get_Object(Am_LABEL).Set(Am_TEXT, msg);
  Am_Value ok;

  Am_Pop_Up_Window_And_Wait(am_askclickpos, ok, false);
  inter.Set(Am_ACTIVE, false);
  if (ok.Valid()) {
    Am_Inter_Location new_loc = am_askclickpos.Get(Am_VALUE);
    if (am_sdebug)
      std::cout << "pop up returned the value " << new_loc << std::endl
                << std::flush;
    Am_Object loc_ref_obj;
    bool as_line;
    new_loc.Translate_To(ref_obj);
    new_loc.Get_Location(as_line, loc_ref_obj, ask_left, ask_top, ask_width,
                         ask_height);
    return true;
  } else
    return false;
}